

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

void __thiscall TextBuffer::reset(TextBuffer *this,Text *new_base_text)

{
  Layer *pLVar1;
  uint32_t uVar2;
  optional<Text> local_78;
  Point local_38;
  Layer *local_30;
  Layer *previous_layer;
  Layer *layer;
  Text *pTStack_18;
  bool has_snapshot;
  Text *new_base_text_local;
  TextBuffer *this_local;
  
  layer._7_1_ = '\0';
  previous_layer = this->top_layer;
  do {
    if (previous_layer == (Layer *)0x0) {
LAB_001bc81e:
      pTStack_18 = new_base_text;
      new_base_text_local = (Text *)this;
      if (layer._7_1_ == '\0') {
        previous_layer = this->top_layer->previous_layer;
        while (pLVar1 = previous_layer, previous_layer != (Layer *)0x0) {
          local_30 = previous_layer->previous_layer;
          if (previous_layer != (Layer *)0x0) {
            Layer::~Layer(previous_layer);
            operator_delete(pLVar1,0xa0);
          }
          previous_layer = local_30;
        }
        local_38 = Text::extent(pTStack_18);
        this->top_layer->extent_ = local_38;
        uVar2 = Text::size(pTStack_18);
        this->top_layer->size_ = uVar2;
        optional<Text>::optional(&local_78,pTStack_18);
        optional<Text>::operator=(&this->top_layer->text,&local_78);
        optional<Text>::~optional(&local_78);
        Patch::clear(&this->top_layer->patch);
        this->top_layer->uses_patch = false;
        this->base_layer = this->top_layer;
        this->top_layer->previous_layer = (Layer *)0x0;
      }
      else {
        set_text(this,&new_base_text->content);
        flush_changes(this);
      }
      return;
    }
    if (previous_layer->snapshot_count != 0) {
      layer._7_1_ = '\x01';
      goto LAB_001bc81e;
    }
    previous_layer = previous_layer->previous_layer;
  } while( true );
}

Assistant:

void TextBuffer::reset(Text &&new_base_text) {
  bool has_snapshot = false;
  auto layer = top_layer;
  while (layer) {
    if (layer->snapshot_count > 0) {
      has_snapshot = true;
      break;
    }
    layer = layer->previous_layer;
  }

  if (has_snapshot) {
    set_text(move(new_base_text.content));
    flush_changes();
    return;
  }

  layer = top_layer->previous_layer;
  while (layer) {
    Layer *previous_layer = layer->previous_layer;
    delete layer;
    layer = previous_layer;
  }

  top_layer->extent_ = new_base_text.extent();
  top_layer->size_ = new_base_text.size();
  top_layer->text = move(new_base_text);
  top_layer->patch.clear();
  top_layer->uses_patch = false;
  base_layer = top_layer;
  top_layer->previous_layer = nullptr;
}